

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_container_select
                (run_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  int iVar1;
  int i;
  long lVar2;
  uint uVar3;
  
  lVar2 = 0;
  do {
    iVar1 = container->n_runs;
    if (iVar1 <= lVar2) {
LAB_00115272:
      return lVar2 < iVar1;
    }
    uVar3 = (uint)container->runs[lVar2].length + *start_rank;
    if (rank <= uVar3) {
      *element = (rank - *start_rank) + (uint)container->runs[lVar2].value;
      goto LAB_00115272;
    }
    *start_rank = uVar3 + 1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

bool run_container_select(const run_container_t *container,
                          uint32_t *start_rank, uint32_t rank,
                          uint32_t *element) {
    for (int i = 0; i < container->n_runs; i++) {
        uint16_t length = container->runs[i].length;
        if (rank <= *start_rank + length) {
            uint16_t value = container->runs[i].value;
            *element = value + rank - (*start_rank);
            return true;
        } else
            *start_rank += length + 1;
    }
    return false;
}